

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib.c
# Opt level: O3

void sprint_long_canframe(char *buf,canfd_frame *cf,int view,int maxdlen)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  __u8 *p_Var5;
  byte bVar6;
  byte bVar7;
  ulong uVar8;
  int iVar9;
  __u8 _Var10;
  long lVar11;
  ulong uVar12;
  byte *pbVar13;
  char *__s;
  char cVar14;
  long lVar15;
  can_frame *ccf;
  uint uVar16;
  
  uVar16 = (uint)cf->len;
  if (maxdlen <= (int)(uint)cf->len) {
    uVar16 = maxdlen;
  }
  builtin_strncpy(buf,"               ",0xf);
  uVar2 = cf->can_id;
  if ((uVar2 >> 0x1d & 1) == 0) {
    if ((int)uVar2 < 0) {
      uVar2 = uVar2 & 0x1fffffff;
      lVar11 = 8;
      do {
        buf[lVar11 + -1] = "0123456789ABCDEF"[uVar2 & 0xf];
        uVar2 = uVar2 >> 4;
        lVar11 = lVar11 + -1;
      } while (lVar11 != 0);
      goto LAB_00101e02;
    }
    uVar2 = uVar2 & 0x7ff;
    if ((view & 0x10U) != 0) {
      lVar11 = 7;
      do {
        buf[lVar11] = "0123456789ABCDEF"[uVar2 & 0xf];
        uVar2 = uVar2 >> 4;
        lVar11 = lVar11 + -1;
      } while (lVar11 != 4);
      goto LAB_00101e02;
    }
    lVar11 = 3;
    do {
      buf[lVar11 + -1] = "0123456789ABCDEF"[uVar2 & 0xf];
      uVar2 = uVar2 >> 4;
      lVar11 = lVar11 + -1;
    } while (lVar11 != 0);
    lVar11 = 5;
  }
  else {
    uVar2 = uVar2 & 0x3fffffff;
    lVar11 = 8;
    do {
      buf[lVar11 + -1] = "0123456789ABCDEF"[uVar2 & 0xf];
      uVar2 = uVar2 >> 4;
      lVar11 = lVar11 + -1;
    } while (lVar11 != 0);
LAB_00101e02:
    lVar11 = 10;
  }
  bVar6 = (byte)uVar16;
  if (maxdlen == 8) {
    if ((view & 0x20U) == 0) {
      buf[lVar11 + 1] = '[';
      bVar6 = bVar6 | 0x30;
      cVar14 = ']';
    }
    else {
      bVar7 = cf->__res1;
      if (6 < (byte)(cf->__res1 - 9)) {
        bVar7 = bVar6;
      }
      if (uVar16 != 8) {
        bVar7 = bVar6;
      }
      buf[lVar11 + 1] = '{';
      bVar6 = "0123456789ABCDEF"[bVar7];
      cVar14 = '}';
    }
    buf[lVar11 + 2] = bVar6;
    buf[lVar11 + 3] = cVar14;
    if ((cf->can_id & 0x40000000) != 0) {
      builtin_strncpy(buf + lVar11 + 5," remote request",0x10);
      return;
    }
  }
  else {
    buf[lVar11] = '[';
    cVar14 = (char)((int)uVar16 / 10);
    buf[lVar11 + 1] = cVar14 + '0';
    buf[lVar11 + 2] = bVar6 + cVar14 * -10 + '0';
    buf[lVar11 + 3] = ']';
  }
  uVar12 = lVar11 + 5;
  if ((view & 2U) == 0) {
    if ((view & 4U) == 0) {
      if (0 < (int)uVar16) {
        uVar12 = (ulong)((int)lVar11 + 5);
        uVar8 = 0;
        do {
          buf[uVar12] = ' ';
          bVar6 = cf->data[uVar8];
          buf[uVar12 + 1] = "0123456789ABCDEF"[bVar6 >> 4];
          buf[uVar12 + 2] = "0123456789ABCDEF"[bVar6 & 0xf];
          uVar12 = uVar12 + 3;
          uVar8 = uVar8 + 1;
        } while (uVar16 != uVar8);
LAB_00101ff5:
        iVar3 = 3;
        uVar12 = uVar12 & 0xffffffff;
        goto LAB_00102079;
      }
    }
    else if (0 < (int)uVar16) {
      uVar12 = (ulong)((int)lVar11 + 5);
      lVar11 = (ulong)(uVar16 - 1) + 1;
      lVar15 = 0;
      do {
        buf[uVar12] = (lVar15 != 0) << 6 | 0x20;
        bVar6 = cf->data[lVar15 + (ulong)(uVar16 - 1)];
        buf[uVar12 + 1] = "0123456789ABCDEF"[bVar6 >> 4];
        buf[uVar12 + 2] = "0123456789ABCDEF"[bVar6 & 0xf];
        uVar12 = uVar12 + 3;
        lVar4 = lVar11 + -1;
        bVar1 = 0 < lVar11;
        lVar11 = lVar4;
        lVar15 = lVar15 + -1;
      } while (lVar4 != 0 && bVar1);
      goto LAB_00101ff5;
    }
    iVar3 = 3;
LAB_0010209b:
    buf[uVar12] = '\0';
    uVar8 = uVar12;
  }
  else {
    if ((view & 4U) == 0) {
      if ((int)uVar16 < 1) {
LAB_00102096:
        iVar3 = 9;
        goto LAB_0010209b;
      }
      uVar8 = 0;
      do {
        iVar9 = (int)uVar12;
        buf[iVar9] = ' ';
        pbVar13 = (byte *)(buf + (iVar9 + 1));
        iVar3 = -1;
        do {
          *pbVar13 = (cf->data[uVar8] >> (iVar3 + 8U & 0x1f) & 1) == 0 ^ 0x31;
          pbVar13 = pbVar13 + 1;
          iVar3 = iVar3 + -1;
        } while (iVar3 != -9);
        uVar12 = (ulong)(iVar9 + 9);
        uVar8 = uVar8 + 1;
      } while (uVar8 != uVar16);
      iVar3 = 9;
      uVar12 = (ulong)(iVar9 + 9);
    }
    else {
      if ((int)uVar16 < 1) goto LAB_00102096;
      uVar8 = (ulong)(uVar16 - 1);
      do {
        iVar9 = (int)uVar12;
        buf[iVar9] = (uVar8 != uVar16 - 1) << 6 | 0x20;
        pbVar13 = (byte *)(buf + (iVar9 + 1));
        iVar3 = -1;
        do {
          *pbVar13 = (cf->data[uVar8] >> (iVar3 + 8U & 0x1f) & 1) == 0 ^ 0x31;
          pbVar13 = pbVar13 + 1;
          iVar3 = iVar3 + -1;
        } while (iVar3 != -9);
        uVar12 = (ulong)(iVar9 + 9);
        bVar1 = 0 < (long)uVar8;
        uVar8 = uVar8 - 1;
      } while (bVar1);
      iVar3 = 9;
      uVar12 = (ulong)(iVar9 + 9);
    }
LAB_00102079:
    uVar8 = (ulong)(int)uVar12;
    buf[uVar8] = '\0';
    if (8 < (int)uVar16) {
      return;
    }
  }
  __s = buf + uVar8;
  if ((cf->can_id & 0x20000000) == 0) {
    if ((view & 1U) != 0) {
      iVar3 = iVar3 * (8 - uVar16);
      uVar8 = (ulong)(iVar3 + 4);
      iVar9 = iVar3 + (int)uVar12 + 4;
      if ((view & 4U) == 0) {
        sprintf(__s,"%*s",uVar8,"\'");
        if (0 < (int)uVar16) {
          uVar12 = 0;
          do {
            _Var10 = cf->data[uVar12];
            if (0x5e < (byte)(_Var10 - 0x20)) {
              _Var10 = '.';
            }
            buf[uVar12 + (long)iVar9] = _Var10;
            uVar12 = uVar12 + 1;
          } while (uVar16 != uVar12);
          iVar9 = iVar9 + (int)uVar12;
        }
        (buf + iVar9)[0] = '\'';
        (buf + iVar9)[1] = '\0';
      }
      else {
        sprintf(__s,"%*s",uVar8,"`");
        if (0 < (int)uVar16) {
          p_Var5 = (__u8 *)(buf + iVar9);
          uVar12 = (ulong)uVar16;
          do {
            _Var10 = cf->data[uVar12 - 1];
            if (0x5e < (byte)(_Var10 - 0x20)) {
              _Var10 = '.';
            }
            *p_Var5 = _Var10;
            p_Var5 = p_Var5 + 1;
            iVar9 = iVar9 + 1;
            bVar1 = 1 < uVar12;
            uVar12 = uVar12 - 1;
          } while (bVar1);
        }
        (buf + iVar9)[0] = '`';
        (buf + iVar9)[1] = '\0';
      }
    }
    return;
  }
  sprintf(__s,"%*s",(ulong)(iVar3 * (8 - uVar16) + 0xd),"ERRORFRAME");
  return;
}

Assistant:

void sprint_long_canframe(char *buf , struct canfd_frame *cf, int view, int maxdlen) {
	/* documentation see lib.h */

	int i, j, dlen, offset;
	int len = (cf->len > maxdlen)? maxdlen : cf->len;

	/* initialize space for CAN-ID and length information */
	memset(buf, ' ', 15);

	if (cf->can_id & CAN_ERR_FLAG) {
		put_eff_id(buf, cf->can_id & (CAN_ERR_MASK|CAN_ERR_FLAG));
		offset = 10;
	} else if (cf->can_id & CAN_EFF_FLAG) {
		put_eff_id(buf, cf->can_id & CAN_EFF_MASK);
		offset = 10;
	} else {
		if (view & CANLIB_VIEW_INDENT_SFF) {
			put_sff_id(buf + 5, cf->can_id & CAN_SFF_MASK);
			offset = 10;
		} else {
			put_sff_id(buf, cf->can_id & CAN_SFF_MASK);
			offset = 5;
		}
	}

	/* The len value is sanitized by maxdlen (see above) */
	if (maxdlen == CAN_MAX_DLEN) {
		if (view & CANLIB_VIEW_LEN8_DLC) {
			struct can_frame *ccf = (struct can_frame *)cf;
			unsigned char dlc = ccf->len8_dlc;

			/* fall back to len if we don't have a valid DLC > 8 */
			if (!((len == CAN_MAX_DLEN) && (dlc > CAN_MAX_DLEN) &&
			      (dlc <= CAN_MAX_RAW_DLC)))
				dlc = len;

			buf[offset + 1] = '{';
			buf[offset + 2] = hex_asc_upper[dlc];
			buf[offset + 3] = '}';
		} else {
			buf[offset + 1] = '[';
			buf[offset + 2] = len + '0';
			buf[offset + 3] = ']';
		}

		/* standard CAN frames may have RTR enabled */
		if (cf->can_id & CAN_RTR_FLAG) {
			sprintf(buf+offset+5, " remote request");
			return;
		}
	} else {
		buf[offset] = '[';
		buf[offset + 1] = (len/10) + '0';
		buf[offset + 2] = (len%10) + '0';
		buf[offset + 3] = ']';
	}
	offset += 5;

	if (view & CANLIB_VIEW_BINARY) {
		dlen = 9; /* _10101010 */
		if (view & CANLIB_VIEW_SWAP) {
			for (i = len - 1; i >= 0; i--) {
				buf[offset++] = (i == len-1)?' ':SWAP_DELIMITER;
				for (j = 7; j >= 0; j--)
					buf[offset++] = (1<<j & cf->data[i])?'1':'0';
			}
		} else {
			for (i = 0; i < len; i++) {
				buf[offset++] = ' ';
				for (j = 7; j >= 0; j--)
					buf[offset++] = (1<<j & cf->data[i])?'1':'0';
			}
		}
	} else {
		dlen = 3; /* _AA */
		if (view & CANLIB_VIEW_SWAP) {
			for (i = len - 1; i >= 0; i--) {
				if (i == len-1)
					buf[offset++] = ' ';
				else
					buf[offset++] = SWAP_DELIMITER;

				put_hex_byte(buf + offset, cf->data[i]);
				offset += 2;
			}
		} else {
			for (i = 0; i < len; i++) {
				buf[offset++] = ' ';
				put_hex_byte(buf + offset, cf->data[i]);
				offset += 2;
			}
		}
	}

	buf[offset] = 0; /* terminate string */

	/*
	 * The ASCII & ERRORFRAME output is put at a fixed len behind the data.
	 * For now we support ASCII output only for payload length up to 8 bytes.
	 * Does it make sense to write 64 ASCII byte behind 64 ASCII HEX data on the console?
	 */
	if (len > CAN_MAX_DLEN)
		return;

	if (cf->can_id & CAN_ERR_FLAG)
		sprintf(buf+offset, "%*s", dlen*(8-len)+13, "ERRORFRAME");
	else if (view & CANLIB_VIEW_ASCII) {
		j = dlen*(8-len)+4;
		if (view & CANLIB_VIEW_SWAP) {
			sprintf(buf+offset, "%*s", j, "`");
			offset += j;
			for (i = len - 1; i >= 0; i--)
				if ((cf->data[i] > 0x1F) && (cf->data[i] < 0x7F))
					buf[offset++] = cf->data[i];
				else
					buf[offset++] = '.';

			sprintf(buf+offset, "`");
		} else {
			sprintf(buf+offset, "%*s", j, "'");
			offset += j;
			for (i = 0; i < len; i++)
				if ((cf->data[i] > 0x1F) && (cf->data[i] < 0x7F))
					buf[offset++] = cf->data[i];
				else
					buf[offset++] = '.';

			sprintf(buf+offset, "'");
		}
	}
}